

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

Apply * __thiscall jsonnet::internal::Desugarer::stdFunc(Desugarer *this,UString *name,AST *v)

{
  Apply *pAVar1;
  initializer_list<jsonnet::internal::ArgParam> __l;
  bool local_c4;
  bool local_c3;
  allocator_type local_c2;
  bool local_c1;
  Index *local_c0;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_b8;
  void *local_a0;
  void *local_98;
  LiteralString *local_90;
  Var *local_88;
  ArgParam local_80;
  
  local_88 = std(this);
  local_c1 = false;
  local_90 = str(this,name);
  local_98 = (void *)0x0;
  local_a0 = (void *)0x0;
  local_c0 = make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                       (this,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_88,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_c1,&local_90,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_98,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,&local_a0,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF);
  ArgParam::ArgParam(&local_80,v,(Fodder *)EF);
  __l._M_len = 1;
  __l._M_array = &local_80;
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            (&local_b8,__l,&local_c2);
  local_c3 = false;
  local_c4 = true;
  pAVar1 = make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Index*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                     (this,&v->location,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,&local_c0,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,&local_b8,&local_c3,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&local_c4);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            (&local_b8);
  ArgParam::~ArgParam(&local_80);
  return pAVar1;
}

Assistant:

Apply *stdFunc(const UString &name, AST *v)
    {
        return make<Apply>(
            v->location,
            EF,
            make<Index>(E, EF, std(), EF, false, str(name), EF, nullptr, EF, nullptr, EF),
            EF,
            ArgParams{{v, EF}},
            false,  // trailingComma
            EF,
            EF,
            true  // tailstrict
        );
    }